

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

int areadfloat(char *file,float **data_ref,int *length_ref)

{
  float fVar1;
  uint uVar2;
  FILE *__stream;
  size_t sVar3;
  float *__ptr;
  ulong uVar4;
  ulong __nmemb;
  int byterev;
  int dummy_length;
  int local_44;
  uint *local_40;
  undefined1 local_34 [4];
  
  uVar2 = get_length(file,&local_44);
  if (-1 < (int)uVar2) {
    __stream = fopen(file,"rb");
    if (__stream == (FILE *)0x0) {
      printf("fopen(%s,rb) failed\n",file);
    }
    else {
      sVar3 = fread(local_34,4,1,__stream);
      if (sVar3 == 1) {
        if (data_ref == (float **)0x0) {
          fclose(__stream);
          if (length_ref == (int *)0x0) {
            return uVar2;
          }
          *length_ref = uVar2;
          return uVar2;
        }
        __nmemb = (ulong)uVar2;
        local_40 = (uint *)length_ref;
        __ptr = (float *)calloc(__nmemb,4);
        if (__ptr == (float *)0x0) {
          areadfloat_cold_1();
        }
        else {
          sVar3 = fread(__ptr,4,__nmemb,__stream);
          if (uVar2 == (uint)sVar3) {
            fclose(__stream);
            *data_ref = __ptr;
            if (uVar2 != 0 && local_44 == 1) {
              uVar4 = 0;
              do {
                fVar1 = __ptr[uVar4];
                __ptr[uVar4] = (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                       ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
                uVar4 = uVar4 + 1;
              } while (__nmemb != uVar4);
            }
            *local_40 = uVar2;
            return uVar2;
          }
          fprintf(_stderr,"areadfloat: %s: expected %d, got %d\n",file,(ulong)uVar2,
                  sVar3 & 0xffffffff);
          fflush(_stdout);
          fclose(__stream);
          free(__ptr);
        }
      }
      else {
        fclose(__stream);
      }
    }
  }
  return -1;
}

Assistant:

int
areadfloat (char *file,
            float **data_ref,
            int *length_ref)
{
  FILE            *fp;
  int             length;
  int             ret, byterev;
  int             offset;
  float           *data;
  int dummy_length;

  /* Get the file length and whether the file needs to be byte-reversed */
  if ((length = get_length(file, &byterev)) < 0) {
      return -1;
  }
  if ((fp = fopen(file, "rb")) == NULL) {
      printf("fopen(%s,rb) failed\n", file);
      return -1;
  }

  /* Read #floats in header, so we start reading at the right position */
  if (fread(&dummy_length, sizeof(int), 1, fp) != 1) {
      fclose (fp);
      return -1;
  }

  /* Just get the file size if we were not given a buffer. */
  if (data_ref == NULL) {
          fclose(fp);
          if (length_ref)
            *length_ref = length;
          return length;
  }

  if ((data = (float *) calloc (length,sizeof(float))) == NULL)
  {
    fprintf (stderr, "areadfloat: %s: can't alloc data\n", file); 
    fflush(stdout);
    fclose (fp);
    return -1;
  }
  if ((ret = fread(data,sizeof(float),length,fp)) != length)
  {
    fprintf (stderr,"areadfloat: %s: expected %d, got %d\n",file,length,ret);
    fflush(stdout);
    fclose (fp);
    free (data);
    return -1;
  }
  fclose (fp);
  *data_ref = (float *) data;
  if (byterev==1) 
     for(offset = 0; offset < length; offset++) MYSWAP_FLOAT(*data_ref+offset);
  *length_ref = length;
  return length;
}